

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void * device_start_nesapu(UINT32 clock,UINT32 rate)

{
  nesapu_state *info;
  UINT32 rate_local;
  UINT32 clock_local;
  
  _rate_local = (nesapu_state *)calloc(1,0x43f0);
  if (_rate_local == (nesapu_state *)0x0) {
    _rate_local = (nesapu_state *)0x0;
  }
  else {
    _rate_local->samps_per_sync = rate / 0x3c;
    _rate_local->buffer_size = _rate_local->samps_per_sync;
    _rate_local->real_rate = _rate_local->samps_per_sync * 0x3c;
    _rate_local->apu_incsize = (float)clock / (float)_rate_local->real_rate;
    create_noise(_rate_local->noise_lut,0xd,0x4000);
    create_vbltimes(_rate_local->vbl_times,
                    "\x05\x7f\n\x01\x13\x02(\x03P\x04\x1e\x05\a\x06\r\a\x06\b\f\t\x18\n0\v`\f$\r\b\x0e\x10\x0f"
                    ,_rate_local->samps_per_sync);
    create_syncs(_rate_local,(ulong)_rate_local->samps_per_sync);
    _rate_local->buffer_size = _rate_local->samps_per_sync + _rate_local->buffer_size;
    (_rate_local->APU).dpcm.memory = (uint8 *)0x0;
    nesapu_set_mute_mask(_rate_local,0);
  }
  return _rate_local;
}

Assistant:

void* device_start_nesapu(UINT32 clock, UINT32 rate)
{
	nesapu_state *info;

	info = (nesapu_state*)calloc(1, sizeof(nesapu_state));
	if (info == NULL)
		return NULL;
	
	/* Initialize global variables */
	info->samps_per_sync = rate / SCREEN_HZ;
	info->buffer_size = info->samps_per_sync;
	info->real_rate = info->samps_per_sync * SCREEN_HZ;
	info->apu_incsize = (float) (clock / (float) info->real_rate);

	/* Use initializer calls */
	create_noise(info->noise_lut, 13, NOISE_LONG);
	create_vbltimes(info->vbl_times,vbl_length,info->samps_per_sync);
	create_syncs(info, info->samps_per_sync);

	/* Adjust buffer size if 16 bits */
	info->buffer_size+=info->samps_per_sync;

	info->APU.dpcm.memory = NULL;

	nesapu_set_mute_mask(info, 0x00);

	return info;
}